

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

void __thiscall GameBoard::GameBoard(GameBoard *this)

{
  EVP_PKEY_CTX *ctx;
  GameBoard *in_RDI;
  GameBoard *local_78;
  int *local_68;
  int *local_58;
  int *local_48;
  int (*local_30) [4] [12];
  int (*local_10) [22] [12];
  
  local_10 = in_RDI->gridInfo;
  do {
    memset(local_10,0,0x420);
    local_10 = local_10 + 1;
  } while (local_10 != (int (*) [22] [12])in_RDI->trans);
  local_30 = in_RDI->trans;
  do {
    memset(local_30,0,0xc0);
    local_30 = local_30 + 1;
  } while (local_30 != (int (*) [4] [12])in_RDI->transCount);
  local_48 = in_RDI->transCount;
  do {
    *local_48 = 0;
    local_48 = local_48 + 1;
  } while (local_48 != in_RDI->maxHeight);
  local_58 = in_RDI->maxHeight;
  do {
    *local_58 = 0;
    local_58 = local_58 + 1;
  } while (local_58 != in_RDI->elimTotal);
  local_68 = in_RDI->elimTotal;
  do {
    *local_68 = 0;
    local_68 = local_68 + 1;
  } while ((int (*) [7])local_68 != in_RDI->typeCountForColor);
  local_78 = (GameBoard *)in_RDI->typeCountForColor;
  do {
    ctx = (EVP_PKEY_CTX *)0x0;
    memset(local_78,0,0x1c);
    local_78 = (GameBoard *)(local_78->gridInfo[0][0] + 2);
  } while (local_78 != in_RDI + 1);
  init(in_RDI,ctx);
  return;
}

Assistant:

GameBoard::GameBoard()
{
    init();
}